

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_uint16_linear_scaled_AR(void *outputp,int width_times_channels,float *encode)

{
  short *psVar1;
  short *psVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  float *pfVar6;
  float *pfVar7;
  short *psVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  auVar5 = _DAT_005ecd70;
  psVar2 = (short *)((long)outputp + (long)width_times_channels * 2);
  fVar9 = (float)DAT_005ecd70;
  fVar10 = DAT_005ecd70._4_4_;
  fVar11 = DAT_005ecd70._8_4_;
  fVar12 = DAT_005ecd70._12_4_;
  if (width_times_channels < 8) {
    auVar14 = _DAT_005ecd70;
    if (3 < width_times_channels) {
      do {
        auVar14._0_4_ = encode[1] * fVar10 + 0.5;
        auVar14._4_4_ = *encode * fVar9 + 0.5;
        auVar14._8_4_ = encode[3] * fVar12 + 0.5;
        auVar14._12_4_ = encode[2] * fVar11 + 0.5;
        auVar14 = minps(auVar14,auVar5);
        auVar14 = maxps(auVar14,ZEXT816(0));
        auVar24._0_4_ = (int)auVar14._0_4_ - (int)stbir__s32_32768[0];
        auVar24._4_4_ = (int)auVar14._4_4_ - stbir__s32_32768[0]._4_4_;
        auVar24._8_4_ = (int)auVar14._8_4_ - (int)stbir__s32_32768[1];
        auVar24._12_4_ = (int)auVar14._12_4_ - stbir__s32_32768[1]._4_4_;
        auVar14 = packssdw(auVar24,auVar24);
        *(ulong *)outputp =
             CONCAT26(auVar14._6_2_ - stbir__s16_32768[0]._6_2_,
                      CONCAT24(auVar14._4_2_ - stbir__s16_32768[0]._4_2_,
                               CONCAT22(auVar14._2_2_ - stbir__s16_32768[0]._2_2_,
                                        auVar14._0_2_ - (short)stbir__s16_32768[0])));
        encode = encode + 4;
        psVar1 = (short *)((long)outputp + 8);
        psVar8 = (short *)((long)outputp + 0x10);
        outputp = psVar1;
        auVar14 = _DAT_005ecd70;
      } while (psVar8 <= psVar2);
    }
    for (; auVar5 = _DAT_005ecd70, outputp < psVar2; outputp = (short *)((long)outputp + 4)) {
      auVar3._4_8_ = in_XMM6._8_8_;
      auVar3._0_4_ = 0x3f000000;
      auVar26._0_8_ = auVar3._0_8_ << 0x20;
      auVar26._8_4_ = 0x3f000000;
      auVar26._12_4_ = 0x3f000000;
      auVar27._4_12_ = auVar26._4_12_;
      auVar27._0_4_ = encode[1] * 65535.0 + 0.5;
      auVar24 = minps(auVar27,_DAT_005ecd70);
      auVar24 = maxps(auVar24,(undefined1  [16])0x0);
      _DAT_005ecd70 = auVar14;
      *(short *)outputp = (short)(int)auVar24._0_4_;
      auVar4._4_8_ = auVar24._8_8_;
      auVar4._0_4_ = 0x3f000000;
      auVar28._0_8_ = auVar4._0_8_ << 0x20;
      auVar28._8_4_ = 0x3f000000;
      auVar28._12_4_ = 0x3f000000;
      auVar29._4_12_ = auVar28._4_12_;
      auVar29._0_4_ = *encode * 65535.0 + 0.5;
      auVar14 = minps(auVar29,auVar5);
      in_XMM6 = maxps(auVar14,(undefined1  [16])0x0);
      *(short *)((long)outputp + 2) = (short)(int)in_XMM6._0_4_;
      encode = encode + 2;
      auVar14 = _DAT_005ecd70;
      _DAT_005ecd70 = auVar5;
    }
  }
  else {
    pfVar6 = encode;
    do {
      psVar1 = (short *)((long)outputp + 0x10);
      psVar8 = psVar2 + -8;
      if (psVar1 == psVar2) {
        psVar8 = psVar1;
      }
      pfVar7 = encode + (long)width_times_channels + -8;
      if (psVar1 == psVar2) {
        pfVar7 = pfVar6 + 8;
      }
      if (psVar1 <= psVar2 + -8) {
        pfVar7 = pfVar6 + 8;
        psVar8 = psVar1;
      }
      auVar13._0_4_ = pfVar6[1] * fVar10 + 0.5;
      auVar13._4_4_ = *pfVar6 * fVar9 + 0.5;
      auVar13._8_4_ = pfVar6[3] * fVar12 + 0.5;
      auVar13._12_4_ = pfVar6[2] * fVar11 + 0.5;
      auVar23._0_4_ = pfVar6[5] * fVar10 + 0.5;
      auVar23._4_4_ = pfVar6[4] * fVar9 + 0.5;
      auVar23._8_4_ = pfVar6[7] * fVar12 + 0.5;
      auVar23._12_4_ = pfVar6[6] * fVar11 + 0.5;
      auVar14 = minps(auVar13,auVar5);
      auVar14 = maxps(auVar14,ZEXT816(0));
      auVar24 = minps(auVar23,auVar5);
      auVar24 = maxps(auVar24,ZEXT816(0));
      auVar15._0_4_ = (int)auVar14._0_4_ - (int)stbir__s32_32768[0];
      auVar15._4_4_ = (int)auVar14._4_4_ - stbir__s32_32768[0]._4_4_;
      auVar15._8_4_ = (int)auVar14._8_4_ - (int)stbir__s32_32768[1];
      auVar15._12_4_ = (int)auVar14._12_4_ - stbir__s32_32768[1]._4_4_;
      auVar25._0_4_ = (int)auVar24._0_4_ - (int)stbir__s32_32768[0];
      auVar25._4_4_ = (int)auVar24._4_4_ - stbir__s32_32768[0]._4_4_;
      auVar25._8_4_ = (int)auVar24._8_4_ - (int)stbir__s32_32768[1];
      auVar25._12_4_ = (int)auVar24._12_4_ - stbir__s32_32768[1]._4_4_;
      auVar14 = packssdw(auVar15,auVar25);
      sVar16 = auVar14._2_2_ - stbir__s16_32768[0]._2_2_;
      sVar17 = auVar14._4_2_ - stbir__s16_32768[0]._4_2_;
      sVar18 = auVar14._6_2_ - stbir__s16_32768[0]._6_2_;
      sVar19 = auVar14._8_2_ - (short)stbir__s16_32768[1];
      sVar20 = auVar14._10_2_ - stbir__s16_32768[1]._2_2_;
      sVar21 = auVar14._12_2_ - stbir__s16_32768[1]._4_2_;
      sVar22 = auVar14._14_2_ - stbir__s16_32768[1]._6_2_;
      *(short *)outputp = auVar14._0_2_ - (short)stbir__s16_32768[0];
      *(short *)((long)outputp + 2) = sVar16;
      *(short *)((long)outputp + 4) = sVar17;
      *(short *)((long)outputp + 6) = sVar18;
      *(short *)((long)outputp + 8) = sVar19;
      *(short *)((long)outputp + 10) = sVar20;
      *(short *)((long)outputp + 0xc) = sVar21;
      *(short *)((long)outputp + 0xe) = sVar22;
      pfVar6 = pfVar7;
      outputp = psVar8;
      auVar14 = _DAT_005ecd70;
    } while (psVar1 != psVar2);
  }
  _DAT_005ecd70 = auVar14;
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__encode_uint16_linear_scaled)( void * outputp, int width_times_channels, float const * encode )
{
  unsigned short STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned short*) outputp;
  unsigned short * end_output = ( (unsigned short*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  {
    if ( width_times_channels >= stbir__simdfX_float_count*2 )
    {
      float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
      end_output -= stbir__simdfX_float_count*2;
      STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
      for(;;)
      {
        stbir__simdfX e0, e1;
        stbir__simdiX i;
        STBIR_SIMD_NO_UNROLL(encode);
        stbir__simdfX_madd_mem( e0, STBIR_simd_point5X, STBIR_max_uint16_as_floatX, encode );
        stbir__simdfX_madd_mem( e1, STBIR_simd_point5X, STBIR_max_uint16_as_floatX, encode+stbir__simdfX_float_count );
        stbir__encode_simdfX_unflip( e0 );
        stbir__encode_simdfX_unflip( e1 );
        stbir__simdfX_pack_to_words( i, e0, e1 );
        stbir__simdiX_store( output, i );
        encode += stbir__simdfX_float_count*2;
        output += stbir__simdfX_float_count*2;
        if ( output <= end_output )
          continue;
        if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
          break;
        output = end_output;     // backup and do last couple
        encode = end_encode_m8;
      }
      return;
    }
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e;
    stbir__simdi i;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e, encode );
    stbir__simdf_madd( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), e );
    stbir__encode_simdf4_unflip( e );
    stbir__simdf_pack_to_8words( i, e, e );  // only use first 4
    stbir__simdi_store2( output-4, i );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    stbir__simdf e;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order0 ); output[0] = stbir__simdf_convert_float_to_short( e );
    #if stbir__coder_min_num >= 2
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order1 ); output[1] = stbir__simdf_convert_float_to_short( e );
    #endif
    #if stbir__coder_min_num >= 3
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order2 ); output[2] = stbir__simdf_convert_float_to_short( e );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0-4] = (unsigned short)f;
    f = encode[stbir__encode_order1] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1-4] = (unsigned short)f;
    f = encode[stbir__encode_order2] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2-4] = (unsigned short)f;
    f = encode[stbir__encode_order3] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[3-4] = (unsigned short)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0] = (unsigned short)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1] = (unsigned short)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2] = (unsigned short)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
  #endif
}